

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

string * google::protobuf::StringReplace
                   (string *__return_storage_ptr__,string *s,string *oldsub,string *newsub,
                   bool replace_all)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  StringReplace(s,oldsub,newsub,replace_all,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string StringReplace(const std::string &s, const std::string &oldsub,
                          const std::string &newsub, bool replace_all) {
  std::string ret;
  StringReplace(s, oldsub, newsub, replace_all, &ret);
  return ret;
}